

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O1

bool anon_unknown.dwarf_f2a380::HandleLockCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  cmMakefile *pcVar1;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  _Alloc_hider _Var7;
  ulong uVar8;
  string *in_base;
  Status SVar9;
  FILE *__stream;
  cmGlobalGenerator *pcVar10;
  undefined8 uVar11;
  pointer pbVar12;
  uint uVar13;
  ulong uVar14;
  cmFileLockPool *this;
  bool bVar15;
  bool bVar16;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_03;
  string_view value;
  string parentDir;
  cmFileLockResult fileLockResult;
  string result;
  long scanned;
  string path;
  string resultVariable;
  int local_134;
  string local_120;
  pointer local_100;
  cmFileLockResult local_f8;
  string local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  undefined8 local_c8;
  size_type local_c0;
  char *local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  char *local_a0;
  undefined8 local_98;
  string local_90;
  string local_70;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  pbVar12 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar12) < 0x21) {
    pcVar1 = status->Makefile;
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f0,"sub-command LOCK requires at least two arguments.","");
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    bVar5 = false;
    goto LAB_003588d0;
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  pcVar2 = pbVar12[1]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar2,pcVar2 + pbVar12[1]._M_string_length);
  pbVar12 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  bVar15 = (ulong)((long)(args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar12) < 0x41;
  bVar5 = !bVar15;
  if (bVar15) {
    bVar4 = false;
    local_134 = 2;
    local_100 = (pointer)0xffffffffffffffff;
    bVar15 = false;
  }
  else {
    local_100 = (pointer)0xffffffffffffffff;
    local_134 = 2;
    bVar15 = false;
    bVar4 = false;
    uVar14 = 2;
    do {
      uVar13 = (uint)uVar14;
      iVar6 = std::__cxx11::string::compare((char *)(pbVar12 + uVar14));
      if (iVar6 == 0) {
        bVar15 = true;
      }
      else {
        iVar6 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar14));
        if (iVar6 == 0) {
          bVar4 = true;
        }
        else {
          iVar6 = std::__cxx11::string::compare
                            ((char *)((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar14));
          if (iVar6 == 0) {
            uVar13 = uVar13 + 1;
            uVar14 = (ulong)uVar13;
            pbVar12 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            if (uVar14 < (ulong)((long)(args->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar12
                                >> 5)) {
              iVar6 = std::__cxx11::string::compare((char *)(pbVar12 + uVar14));
              bVar3 = true;
              if (iVar6 == 0) {
                local_134 = 0;
              }
              else {
                iVar6 = std::__cxx11::string::compare
                                  ((char *)((args->
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start + uVar14));
                if (iVar6 == 0) {
                  local_134 = 1;
                }
                else {
                  iVar6 = std::__cxx11::string::compare
                                    ((char *)((args->
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              )._M_impl.super__Vector_impl_data._M_start + uVar14));
                  if (iVar6 != 0) {
                    pcVar1 = status->Makefile;
                    pbVar12 = (args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start;
                    local_f0._M_dataplus._M_p = (pointer)0x2e;
                    local_f0._M_string_length = 0x851331;
                    local_f0.field_2._M_allocated_capacity = 0;
                    local_f0.field_2._8_8_ = 0xe;
                    local_d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)0x851360;
                    local_c8 = 0;
                    local_b8 = pbVar12[uVar14]._M_dataplus._M_p;
                    local_c0 = pbVar12[uVar14]._M_string_length;
                    local_b0 = 0;
                    local_a8 = 2;
                    local_a0 = "\".";
                    local_98 = 0;
                    views_00._M_len = 4;
                    views_00._M_array = (iterator)&local_f0;
                    cmCatViews(&local_120,views_00);
                    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_120);
                    uVar11 = local_120.field_2._M_allocated_capacity;
                    _Var7._M_p = local_120._M_dataplus._M_p;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_120._M_dataplus._M_p != &local_120.field_2) goto LAB_003586c7;
                    goto LAB_003586cf;
                  }
                  local_134 = 2;
                }
              }
            }
            else {
              pcVar1 = status->Makefile;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_f0,"expected FUNCTION, FILE or PROCESS after GUARD",
                         (allocator<char> *)&local_120);
              cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_f0);
              uVar11 = local_f0.field_2._M_allocated_capacity;
              _Var7._M_p = local_f0._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
LAB_003586c7:
                operator_delete(_Var7._M_p,uVar11 + 1);
              }
LAB_003586cf:
              bVar3 = false;
            }
            if (!bVar3) break;
          }
          else {
            iVar6 = std::__cxx11::string::compare
                              ((char *)((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + uVar14));
            if (iVar6 == 0) {
              uVar13 = uVar13 + 1;
              if ((ulong)((long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start >> 5) <= (ulong)uVar13) {
                pcVar1 = status->Makefile;
                local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_f0,"expected variable name after RESULT_VARIABLE","");
                cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_f0);
LAB_00358b2e:
                uVar11 = local_f0.field_2._M_allocated_capacity;
                _Var7._M_p = local_f0._M_dataplus._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_f0._M_dataplus._M_p != &local_f0.field_2) goto LAB_00358b46;
                break;
              }
              std::__cxx11::string::_M_assign((string *)&local_50);
            }
            else {
              iVar6 = std::__cxx11::string::compare
                                ((char *)((args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start + uVar14));
              if (iVar6 != 0) {
                pcVar1 = status->Makefile;
                pbVar12 = (args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start;
                local_f0._M_dataplus._M_p = (pointer)0x37;
                local_f0._M_string_length = 0x8513d1;
                local_f0.field_2._M_allocated_capacity = 0;
                local_f0.field_2._8_8_ = 0x12;
                local_d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)0x851409;
                local_c8 = 0;
                local_b8 = pbVar12[uVar14]._M_dataplus._M_p;
                local_c0 = pbVar12[uVar14]._M_string_length;
                local_b0 = 0;
                local_a8 = 2;
                local_a0 = "\".";
                local_98 = 0;
                views_03._M_len = 4;
                views_03._M_array = (iterator)&local_f0;
                cmCatViews(&local_120,views_03);
                cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_120);
                uVar11 = local_120.field_2._M_allocated_capacity;
                _Var7._M_p = local_120._M_dataplus._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_120._M_dataplus._M_p != &local_120.field_2) {
LAB_00358b46:
                  operator_delete(_Var7._M_p,uVar11 + 1);
                }
                break;
              }
              uVar13 = uVar13 + 1;
              uVar14 = (ulong)uVar13;
              pbVar12 = (args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              if ((ulong)((long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar12 >> 5) <=
                  uVar14) {
                pcVar1 = status->Makefile;
                local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_f0,"expected timeout value after TIMEOUT","");
                cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_f0);
                goto LAB_00358b2e;
              }
              bVar3 = cmStrToLong(pbVar12 + uVar14,(long *)&local_90);
              bVar16 = (long)local_90._M_dataplus._M_p < 0;
              _Var7._M_p = local_90._M_dataplus._M_p;
              if (!bVar3 || bVar16) {
                pcVar1 = status->Makefile;
                pbVar12 = (args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start;
                local_f0._M_dataplus._M_p = (pointer)0xf;
                local_f0._M_string_length = 0x8513c1;
                local_f0.field_2._M_allocated_capacity = 0;
                local_d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)pbVar12[uVar14]._M_dataplus._M_p;
                local_f0.field_2._8_8_ = pbVar12[uVar14]._M_string_length;
                local_c8 = 0;
                local_c0 = 0x1d;
                local_b8 = "\" is not an unsigned integer.";
                local_b0 = 0;
                views._M_len = 3;
                views._M_array = (iterator)&local_f0;
                cmCatViews(&local_120,views);
                cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_120);
                _Var7._M_p = local_100;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_120._M_dataplus._M_p != &local_120.field_2) {
                  operator_delete(local_120._M_dataplus._M_p,
                                  local_120.field_2._M_allocated_capacity + 1);
                  _Var7._M_p = local_100;
                }
              }
              local_100 = _Var7._M_p;
              if (!bVar3 || bVar16) break;
            }
          }
        }
      }
      uVar14 = (ulong)(uVar13 + 1);
      pbVar12 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      uVar8 = (long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar12 >> 5;
      bVar5 = uVar14 < uVar8;
    } while (uVar14 < uVar8);
  }
  if (bVar5) {
    bVar5 = false;
  }
  else {
    if (bVar15) {
      std::__cxx11::string::append((char *)&local_70);
    }
    in_base = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(status->Makefile);
    cmsys::SystemTools::CollapseFullPath(&local_f0,&local_70,in_base);
    std::__cxx11::string::operator=((string *)&local_70,(string *)&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    cmsys::SystemTools::GetParentDirectory(&local_120,&local_70);
    SVar9 = cmsys::SystemTools::MakeDirectory(&local_120,(mode_t *)0x0);
    if (SVar9.Kind_ == Success) {
      __stream = (FILE *)cmsys::SystemTools::Fopen(&local_70,"w");
      if (__stream == (FILE *)0x0) {
        pcVar1 = status->Makefile;
        local_f0._M_dataplus._M_p = (pointer)0x8;
        local_f0._M_string_length = 0x85146b;
        local_f0.field_2._M_allocated_capacity = 0;
        local_f0.field_2._8_8_ = local_70._M_string_length;
        local_d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_70._M_dataplus._M_p;
        local_c8 = 0;
        local_c0 = 0x26;
        local_b8 = "\"\ncreation failed (check permissions).";
        local_b0 = 0;
        views_02._M_len = 3;
        views_02._M_array = (iterator)&local_f0;
        cmCatViews(&local_90,views_02);
        cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_90);
        goto LAB_00358863;
      }
      fclose(__stream);
      pcVar10 = cmMakefile::GetGlobalGenerator(status->Makefile);
      local_f8 = cmFileLockResult::MakeOk();
      this = &pcVar10->FileLockPool;
      if (bVar4) {
        local_f8 = cmFileLockPool::Release(this,&local_70);
      }
      else if (local_134 == 2) {
        local_f8 = cmFileLockPool::LockProcessScope(this,&local_70,(unsigned_long)local_100);
      }
      else if (local_134 == 1) {
        local_f8 = cmFileLockPool::LockFileScope(this,&local_70,(unsigned_long)local_100);
      }
      else {
        local_f8 = cmFileLockPool::LockFunctionScope(this,&local_70,(unsigned_long)local_100);
      }
      cmFileLockResult::GetOutputMessage_abi_cxx11_(&local_f0,&local_f8);
      if ((local_50._M_string_length != 0) || (bVar5 = cmFileLockResult::IsOk(&local_f8), bVar5)) {
        bVar5 = true;
        if (local_50._M_string_length != 0) {
          value._M_str = local_f0._M_dataplus._M_p;
          value._M_len = local_f0._M_string_length;
          cmMakefile::AddDefinition(status->Makefile,&local_50,value);
        }
      }
      else {
        pcVar1 = status->Makefile;
        cmStrCat<char_const(&)[23],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string_const&,char_const(&)[2]>
                  (&local_90,(char (*) [23])"error locking file\n  \"",&local_70,
                   (char (*) [3])0x86e76f,&local_f0,(char (*) [2])0x82ea59);
        cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        cmSystemTools::s_FatalErrorOccurred = true;
        bVar5 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      pcVar1 = status->Makefile;
      local_f0._M_dataplus._M_p = (pointer)0xd;
      local_f0._M_string_length = 0x851428;
      local_f0.field_2._M_allocated_capacity = 0;
      local_f0.field_2._8_8_ = local_120._M_string_length;
      local_d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_120._M_dataplus._M_p;
      local_c8 = 0;
      local_c0 = 0x26;
      local_b8 = "\"\ncreation failed (check permissions).";
      local_b0 = 0;
      views_01._M_len = 3;
      views_01._M_array = (iterator)&local_f0;
      cmCatViews(&local_90,views_01);
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_90);
LAB_00358863:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      cmSystemTools::s_FatalErrorOccurred = true;
      bVar5 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
LAB_003588d0:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return bVar5;
}

Assistant:

bool HandleLockCommand(std::vector<std::string> const& args,
                       cmExecutionStatus& status)
{
#if !defined(CMAKE_BOOTSTRAP)
  // Default values
  bool directory = false;
  bool release = false;
  enum Guard
  {
    GUARD_FUNCTION,
    GUARD_FILE,
    GUARD_PROCESS
  };
  Guard guard = GUARD_PROCESS;
  std::string resultVariable;
  unsigned long timeout = static_cast<unsigned long>(-1);

  // Parse arguments
  if (args.size() < 2) {
    status.GetMakefile().IssueMessage(
      MessageType::FATAL_ERROR,
      "sub-command LOCK requires at least two arguments.");
    return false;
  }

  std::string path = args[1];
  for (unsigned i = 2; i < args.size(); ++i) {
    if (args[i] == "DIRECTORY") {
      directory = true;
    } else if (args[i] == "RELEASE") {
      release = true;
    } else if (args[i] == "GUARD") {
      ++i;
      const char* merr = "expected FUNCTION, FILE or PROCESS after GUARD";
      if (i >= args.size()) {
        status.GetMakefile().IssueMessage(MessageType::FATAL_ERROR, merr);
        return false;
      }
      if (args[i] == "FUNCTION") {
        guard = GUARD_FUNCTION;
      } else if (args[i] == "FILE") {
        guard = GUARD_FILE;
      } else if (args[i] == "PROCESS") {
        guard = GUARD_PROCESS;
      } else {
        status.GetMakefile().IssueMessage(
          MessageType::FATAL_ERROR,
          cmStrCat(merr, ", but got:\n  \"", args[i], "\"."));
        return false;
      }

    } else if (args[i] == "RESULT_VARIABLE") {
      ++i;
      if (i >= args.size()) {
        status.GetMakefile().IssueMessage(
          MessageType::FATAL_ERROR,
          "expected variable name after RESULT_VARIABLE");
        return false;
      }
      resultVariable = args[i];
    } else if (args[i] == "TIMEOUT") {
      ++i;
      if (i >= args.size()) {
        status.GetMakefile().IssueMessage(
          MessageType::FATAL_ERROR, "expected timeout value after TIMEOUT");
        return false;
      }
      long scanned;
      if (!cmStrToLong(args[i], &scanned) || scanned < 0) {
        status.GetMakefile().IssueMessage(
          MessageType::FATAL_ERROR,
          cmStrCat("TIMEOUT value \"", args[i],
                   "\" is not an unsigned integer."));
        return false;
      }
      timeout = static_cast<unsigned long>(scanned);
    } else {
      status.GetMakefile().IssueMessage(
        MessageType::FATAL_ERROR,
        cmStrCat("expected DIRECTORY, RELEASE, GUARD, RESULT_VARIABLE or ",
                 "TIMEOUT\nbut got: \"", args[i], "\"."));
      return false;
    }
  }

  if (directory) {
    path += "/cmake.lock";
  }

  // Unify path (remove '//', '/../', ...)
  path = cmSystemTools::CollapseFullPath(
    path, status.GetMakefile().GetCurrentSourceDirectory());

  // Create file and directories if needed
  std::string parentDir = cmSystemTools::GetParentDirectory(path);
  if (!cmSystemTools::MakeDirectory(parentDir)) {
    status.GetMakefile().IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("directory\n  \"", parentDir,
               "\"\ncreation failed (check permissions)."));
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }
  FILE* file = cmsys::SystemTools::Fopen(path, "w");
  if (!file) {
    status.GetMakefile().IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("file\n  \"", path,
               "\"\ncreation failed (check permissions)."));
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }
  fclose(file);

  // Actual lock/unlock
  cmFileLockPool& lockPool =
    status.GetMakefile().GetGlobalGenerator()->GetFileLockPool();

  cmFileLockResult fileLockResult(cmFileLockResult::MakeOk());
  if (release) {
    fileLockResult = lockPool.Release(path);
  } else {
    switch (guard) {
      case GUARD_FUNCTION:
        fileLockResult = lockPool.LockFunctionScope(path, timeout);
        break;
      case GUARD_FILE:
        fileLockResult = lockPool.LockFileScope(path, timeout);
        break;
      case GUARD_PROCESS:
        fileLockResult = lockPool.LockProcessScope(path, timeout);
        break;
      default:
        cmSystemTools::SetFatalErrorOccurred();
        return false;
    }
  }

  const std::string result = fileLockResult.GetOutputMessage();

  if (resultVariable.empty() && !fileLockResult.IsOk()) {
    status.GetMakefile().IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("error locking file\n  \"", path, "\"\n", result, "."));
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  if (!resultVariable.empty()) {
    status.GetMakefile().AddDefinition(resultVariable, result);
  }

  return true;
#else
  static_cast<void>(args);
  status.SetError("sub-command LOCK not implemented in bootstrap cmake");
  return false;
#endif
}